

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

int match_iface(char *rule,char *iface)

{
  int local_24;
  int i;
  char *iface_local;
  char *rule_local;
  
  if (*rule == '\0') {
    rule_local._4_4_ = 1;
  }
  else if (iface == (char *)0x0) {
    rule_local._4_4_ = 0;
  }
  else {
    for (local_24 = 0; (local_24 < 0x10 && (rule[local_24] != '+')); local_24 = local_24 + 1) {
      if (rule[local_24] != iface[local_24]) {
        return 0;
      }
      if (rule[local_24] == '\0') break;
    }
    rule_local._4_4_ = 1;
  }
  return rule_local._4_4_;
}

Assistant:

int match_iface(const char *rule, const char *iface)
{
	if (rule[0] == '\0') {
		return 1;
	}

	if (iface == NULL) {
		return 0;
	}

	for (int i = 0; i < MAX_IFACE_LEN; i++) {

		if (rule[i] == '+') {
			break;
		}

		if (rule[i] != iface[i]) {
			return 0;
		}

		if (rule[i] == '\0') {
			break;
		}
	}

	return 1;
}